

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_group_scrolled_end(nk_context *ctx)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar4;
  nk_vec2 nVar3;
  nk_window *pnVar5;
  nk_panel *pnVar6;
  nk_panel *pnVar7;
  float x0;
  float y0;
  float fVar8;
  float fVar9;
  float fVar10;
  nk_rect clip;
  nk_rect local_218;
  nk_window local_208;
  
  if (ctx == (nk_context *)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5629,"void nk_group_scrolled_end(struct nk_context *)");
  }
  pnVar5 = ctx->current;
  if (pnVar5 == (nk_window *)0x0) {
    __assert_fail("ctx->current",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x562a,"void nk_group_scrolled_end(struct nk_context *)");
  }
  pnVar6 = pnVar5->layout;
  if (pnVar6 == (nk_panel *)0x0) {
    __assert_fail("win->layout",
                  "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                  ,0x5631,"void nk_group_scrolled_end(struct nk_context *)");
  }
  pnVar7 = pnVar6->parent;
  if (pnVar7 != (nk_panel *)0x0) {
    nk_zero(&local_208,0x1d8);
    fVar9 = (ctx->style).window.group_padding.x;
    fVar8 = (pnVar6->menu).h;
    uVar2 = (pnVar6->bounds).x;
    uVar4 = (pnVar6->bounds).y;
    x0 = (float)uVar2 - fVar9;
    y0 = (float)uVar4 - (pnVar6->header_height + fVar8);
    local_208.bounds.y = y0;
    local_208.bounds.x = x0;
    fVar10 = fVar9 + fVar9 + (pnVar6->bounds).w;
    fVar8 = pnVar6->header_height + (pnVar6->bounds).h + fVar8;
    local_208.bounds.h = fVar8;
    local_208.bounds.w = fVar10;
    local_208.flags = pnVar6->flags;
    if ((local_208.flags & 1) != 0) {
      fVar1 = pnVar6->border;
      x0 = x0 - fVar1;
      y0 = y0 - fVar1;
      fVar10 = fVar10 + fVar1 + fVar1;
      fVar8 = fVar8 + fVar1 + fVar1;
      local_208.bounds.y = y0;
      local_208.bounds.x = x0;
      local_208.bounds.h = fVar8;
      local_208.bounds.w = fVar10;
    }
    if ((local_208.flags & 0x20) == 0) {
      nVar3 = (ctx->style).window.scrollbar_size;
      fVar10 = fVar10 + nVar3.x;
      fVar8 = fVar8 + nVar3.y;
      local_208.bounds.h = fVar8;
      local_208.bounds.w = fVar10;
    }
    local_208.scrollbar.x = *pnVar6->offset_x;
    local_208.scrollbar.y = *pnVar6->offset_y;
    local_208.buffer.base = (pnVar5->buffer).base;
    local_208.buffer.clip.x = (pnVar5->buffer).clip.x;
    local_208.buffer.clip.y = (pnVar5->buffer).clip.y;
    local_208.buffer.clip.w = (pnVar5->buffer).clip.w;
    local_208.buffer.clip.h = (pnVar5->buffer).clip.h;
    local_208.buffer.use_clipping = (pnVar5->buffer).use_clipping;
    local_208.buffer._28_4_ = *(undefined4 *)&(pnVar5->buffer).field_0x1c;
    local_208.buffer.userdata = (pnVar5->buffer).userdata;
    local_208.buffer.begin = (pnVar5->buffer).begin;
    local_208.buffer.end = (pnVar5->buffer).end;
    local_208.buffer.last = (pnVar5->buffer).last;
    ctx->current = &local_208;
    local_208.layout = pnVar6;
    local_208.parent = pnVar5;
    nk_unify(&local_218,&pnVar7->clip,x0,y0,x0 + fVar10,fVar9 + fVar8 + y0);
    nk_push_scissor(&local_208.buffer,local_218);
    nk_end(ctx);
    (pnVar5->buffer).end = local_208.buffer.end;
    (pnVar5->buffer).last = local_208.buffer.last;
    (pnVar5->buffer).userdata = local_208.buffer.userdata;
    (pnVar5->buffer).begin = local_208.buffer.begin;
    (pnVar5->buffer).clip.w = local_208.buffer.clip.w;
    (pnVar5->buffer).clip.h = local_208.buffer.clip.h;
    (pnVar5->buffer).use_clipping = local_208.buffer.use_clipping;
    *(undefined4 *)&(pnVar5->buffer).field_0x1c = local_208.buffer._28_4_;
    (pnVar5->buffer).base = local_208.buffer.base;
    (pnVar5->buffer).clip.x = local_208.buffer.clip.x;
    (pnVar5->buffer).clip.y = local_208.buffer.clip.y;
    nk_push_scissor(&pnVar5->buffer,pnVar7->clip);
    ctx->current = pnVar5;
    pnVar5->layout = pnVar7;
    (pnVar6->bounds).x = local_208.bounds.x;
    (pnVar6->bounds).y = local_208.bounds.y;
    (pnVar6->bounds).w = local_208.bounds.w;
    (pnVar6->bounds).h = local_208.bounds.h;
    return;
  }
  __assert_fail("g->parent",
                "/workspace/llm4binary/github/license_c_cmakelists/Konf[P]LearnOpenGL-CLion/glfw/deps/nuklear.h"
                ,0x5633,"void nk_group_scrolled_end(struct nk_context *)");
}

Assistant:

NK_API void
nk_group_scrolled_end(struct nk_context *ctx)
{
    struct nk_window *win;
    struct nk_panel *parent;
    struct nk_panel *g;

    struct nk_rect clip;
    struct nk_window pan;
    struct nk_vec2 panel_padding;

    NK_ASSERT(ctx);
    NK_ASSERT(ctx->current);
    if (!ctx || !ctx->current)
        return;

    /* make sure nk_group_begin was called correctly */
    NK_ASSERT(ctx->current);
    win = ctx->current;
    NK_ASSERT(win->layout);
    g = win->layout;
    NK_ASSERT(g->parent);
    parent = g->parent;

    /* dummy window */
    nk_zero_struct(pan);
    panel_padding = nk_panel_get_padding(&ctx->style, NK_PANEL_GROUP);
    pan.bounds.y = g->bounds.y - (g->header_height + g->menu.h);
    pan.bounds.x = g->bounds.x - panel_padding.x;
    pan.bounds.w = g->bounds.w + 2 * panel_padding.x;
    pan.bounds.h = g->bounds.h + g->header_height + g->menu.h;
    if (g->flags & NK_WINDOW_BORDER) {
        pan.bounds.x -= g->border;
        pan.bounds.y -= g->border;
        pan.bounds.w += 2*g->border;
        pan.bounds.h += 2*g->border;
    }
    if (!(g->flags & NK_WINDOW_NO_SCROLLBAR)) {
        pan.bounds.w += ctx->style.window.scrollbar_size.x;
        pan.bounds.h += ctx->style.window.scrollbar_size.y;
    }
    pan.scrollbar.x = *g->offset_x;
    pan.scrollbar.y = *g->offset_y;
    pan.flags = g->flags;
    pan.buffer = win->buffer;
    pan.layout = g;
    pan.parent = win;
    ctx->current = &pan;

    /* make sure group has correct clipping rectangle */
    nk_unify(&clip, &parent->clip, pan.bounds.x, pan.bounds.y,
        pan.bounds.x + pan.bounds.w, pan.bounds.y + pan.bounds.h + panel_padding.x);
    nk_push_scissor(&pan.buffer, clip);
    nk_end(ctx);

    win->buffer = pan.buffer;
    nk_push_scissor(&win->buffer, parent->clip);
    ctx->current = win;
    win->layout = parent;
    g->bounds = pan.bounds;
    return;
}